

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneofFields
          (MessageGenerator *this,Printer *printer,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,bool to_array)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar1;
  bool bVar2;
  LogMessage *other;
  size_type sVar3;
  const_reference ppFVar4;
  string *psVar5;
  ulong uVar6;
  FieldGenerator *pFVar7;
  string local_b0;
  FieldDescriptor *local_90;
  FieldDescriptor *field;
  OneofDescriptor *pOStack_80;
  int i;
  OneofDescriptor *oneof;
  byte local_61;
  LogMessage local_60;
  byte local_21;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvStack_20;
  bool to_array_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_21 = to_array;
  pvStack_20 = fields;
  fields_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)printer;
  printer_local = (Printer *)this;
  bVar2 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty(fields);
  local_61 = 0;
  if (bVar2) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0xde0);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: !fields.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&oneof + 3),other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  sVar3 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size(pvStack_20);
  pvVar1 = fields_local;
  if (sVar3 == 1) {
    ppFVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](pvStack_20,0);
    GenerateSerializeOneField(this,(Printer *)pvVar1,*ppFVar4,(bool)(local_21 & 1),-1);
  }
  else {
    ppFVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](pvStack_20,0);
    pOStack_80 = FieldDescriptor::containing_oneof(*ppFVar4);
    pvVar1 = fields_local;
    psVar5 = OneofDescriptor::name_abi_cxx11_(pOStack_80);
    io::Printer::Print((Printer *)pvVar1,"switch ($oneofname$_case()) {\n","oneofname",psVar5);
    io::Printer::Indent((Printer *)fields_local);
    for (field._4_4_ = 0; uVar6 = (ulong)field._4_4_,
        sVar3 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(pvStack_20), uVar6 < sVar3; field._4_4_ = field._4_4_ + 1) {
      ppFVar4 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](pvStack_20,(long)field._4_4_);
      pvVar1 = fields_local;
      local_90 = *ppFVar4;
      psVar5 = FieldDescriptor::name_abi_cxx11_(local_90);
      UnderscoresToCamelCase(&local_b0,psVar5,true);
      io::Printer::Print((Printer *)pvVar1,"case k$field_name$:\n","field_name",&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      io::Printer::Indent((Printer *)fields_local);
      if ((local_21 & 1) == 0) {
        pFVar7 = FieldGeneratorMap::get(&this->field_generators_,local_90);
        (*pFVar7->_vptr_FieldGenerator[0x15])(pFVar7,fields_local);
      }
      else {
        pFVar7 = FieldGeneratorMap::get(&this->field_generators_,local_90);
        (*pFVar7->_vptr_FieldGenerator[0x16])(pFVar7,fields_local);
      }
      io::Printer::Print((Printer *)fields_local,"break;\n");
      io::Printer::Outdent((Printer *)fields_local);
    }
    io::Printer::Outdent((Printer *)fields_local);
    io::Printer::Print((Printer *)fields_local,"  default: ;\n}\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneofFields(
    io::Printer* printer, const std::vector<const FieldDescriptor*>& fields,
    bool to_array) {
  GOOGLE_CHECK(!fields.empty());
  if (fields.size() == 1) {
    GenerateSerializeOneField(printer, fields[0], to_array, -1);
    return;
  }
  // We have multiple mutually exclusive choices.  Emit a switch statement.
  const OneofDescriptor* oneof = fields[0]->containing_oneof();
  printer->Print(
    "switch ($oneofname$_case()) {\n",
    "oneofname", oneof->name());
  printer->Indent();
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    printer->Print(
      "case k$field_name$:\n",
      "field_name", UnderscoresToCamelCase(field->name(), true));
    printer->Indent();
    if (to_array) {
      field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
          printer);
    } else {
      field_generators_.get(field).GenerateSerializeWithCachedSizes(printer);
    }
    printer->Print(
      "break;\n");
    printer->Outdent();
  }
  printer->Outdent();
  // Doing nothing is an option.
  printer->Print(
    "  default: ;\n"
    "}\n");
}